

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::LongStressCase::iterate(LongStressCase *this)

{
  GLsizei count;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *pGVar1;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *pGVar2;
  DebugInfoRenderer *this_00;
  undefined4 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  int iVar9;
  GLenum err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar10;
  const_reference source;
  deUint64 dVar11;
  Program *pPVar12;
  reference pvVar13;
  TextureLevel *pTVar14;
  reference pvVar15;
  Texture *pTVar16;
  const_reference pvVar17;
  Buffer *pBVar18;
  reference pvVar19;
  const_reference pvVar20;
  reference indices;
  deUint64 dVar21;
  TestLog *pTVar22;
  MessageBuilder *pMVar23;
  socklen_t __len;
  int precision;
  int precision_00;
  int precision_01;
  int precision_02;
  sockaddr *__addr;
  deUint64 seconds;
  float fVar25;
  float local_1694;
  deUint32 local_1578;
  deUint32 local_1554;
  deUint32 local_14f8;
  deUint32 local_14c4;
  deUint32 local_1480;
  deUint32 local_145c;
  string local_1320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1300;
  int local_12dc;
  undefined1 local_12d8 [4];
  int i_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  int local_1294;
  undefined1 local_1290 [4];
  int i_8;
  string local_1270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1250;
  int local_122c;
  undefined1 local_1228 [4];
  int i_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  int local_11e4;
  undefined1 local_11e0 [4];
  int i_6;
  string local_11c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a0;
  undefined1 local_1180 [8];
  string curAttrBufNamePrefix;
  undefined1 local_1158 [4];
  int attrNdx_1;
  undefined1 local_1138 [8];
  string texName_1;
  undefined1 local_1110 [4];
  int texNdx_1;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  string local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  LogSection local_fd0;
  MessageBuilder local_f90;
  MessageBuilder local_e10;
  MessageBuilder local_c90;
  MessageBuilder local_b10;
  MessageBuilder local_990;
  MessageBuilder local_810;
  MessageBuilder local_690;
  int local_50c;
  ulong uStack_508;
  int iterDiff;
  deUint64 timeDiff;
  deUint64 time;
  deUint64 loggingIntervalSeconds;
  int local_4e8;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  deUint32 target_2;
  Buffer *attrBuf;
  undefined1 local_4c8 [7];
  bool hadAttrBuffer;
  undefined1 local_4a8 [8];
  string attrBufName;
  int redundantBufferNdx_1;
  int usedRedundantBufferNdx_1;
  deUint32 target_1;
  Buffer *curAttrBuf;
  undefined1 local_468 [7];
  bool hadCurAttrBuffer;
  string local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  undefined1 local_3e8 [8];
  string curAttrBufName;
  int redundantBufferNdx;
  int usedRedundantBufferNdx;
  int attrNdx;
  deUint32 target;
  Buffer *indexBuf;
  iterator iStack_3a8;
  bool hadIndexBuffer;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_3a0;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  int local_354;
  iterator iStack_350;
  int i_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_348;
  int local_340;
  allocator<int> local_339;
  int i;
  vector<int,_std::allocator<int>_> texSpecIndices;
  ConstPixelBufferAccess local_2f8;
  Texture *local_2d0;
  Texture *texture;
  TextureSpec *spec;
  undefined1 local_2b8 [7];
  bool hadTexture;
  undefined1 local_298 [8];
  string texName;
  int texNdx;
  Program *program;
  string local_248;
  unsigned_short local_222;
  string local_220;
  Program *local_200;
  Program *prog;
  undefined1 local_1f0 [7];
  bool hadProgram;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  string separateAttrBufNamePrefix;
  undefined1 local_170 [8];
  string indexBufferName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string unitedAttrBufferNamePrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string textureNamePrefix;
  string local_80;
  undefined1 local_60 [8];
  string programName;
  ProgramResources *programResources;
  ProgramContext *programContext;
  int progContextNdx;
  bool separateAttributeBuffers;
  bool useDrawArrays;
  int iStack_24;
  bool useClientMemoryIndexData;
  int renderHeight;
  int renderWidth;
  TestLog *log;
  LongStressCase *this_local;
  Random *pRVar24;
  
  log = (TestLog *)this;
  _renderHeight = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iStack_24 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var,iVar6));
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  progContextNdx = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_00,iVar6));
  pRVar24 = &this->m_rnd;
  fVar25 = de::Random::getFloat(pRVar24);
  programContext._7_1_ = fVar25 < (this->m_probabilities).clientMemoryIndexData;
  fVar25 = de::Random::getFloat(pRVar24);
  programContext._6_1_ = fVar25 < (this->m_probabilities).useDrawArrays;
  fVar25 = de::Random::getFloat(pRVar24);
  programContext._5_1_ = fVar25 < (this->m_probabilities).separateAttributeBuffers;
  sVar10 = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::size
                     (&this->m_programContexts);
  programContext._0_4_ = de::Random::getInt(pRVar24,0,(int)sVar10 + -1);
  source = std::vector<deqp::gls::ProgramContext,_std::allocator<deqp::gls::ProgramContext>_>::
           operator[](&this->m_programContexts,(long)(int)programContext);
  programName.field_2._8_8_ =
       std::
       vector<deqp::gls::LongStressCase::ProgramResources,_std::allocator<deqp::gls::LongStressCase::ProgramResources>_>
       ::operator[](&this->m_programResources,(long)(int)programContext);
  de::toString<int>(&local_80,(int *)&programContext);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 "prog",&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  de::toString<int>((string *)((long)&unitedAttrBufferNamePrefix.field_2 + 8),(int *)&programContext
                   );
  std::operator+(&local_d0,"tex",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&unitedAttrBufferNamePrefix.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_d0,"_");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)(unitedAttrBufferNamePrefix.field_2._M_local_buf + 8));
  de::toString<int>((string *)((long)&indexBufferName.field_2 + 8),(int *)&programContext);
  std::operator+(&local_130,"attrBuf",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&indexBufferName.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                 &local_130,"_");
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)(indexBufferName.field_2._M_local_buf + 8));
  de::toString<int>((string *)((long)&separateAttrBufNamePrefix.field_2 + 8),(int *)&programContext)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 "indexBuf",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&separateAttrBufNamePrefix.field_2 + 8));
  std::__cxx11::string::~string((string *)(separateAttrBufNamePrefix.field_2._M_local_buf + 8));
  de::toString<int>((string *)local_1f0,(int *)&programContext);
  std::operator+(&local_1d0,"attrBuf",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                 &local_1d0,"_");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)local_1f0);
  if (this->m_currentIteration == 0) {
    dVar11 = deGetTime();
    this->m_startTimeSeconds = dVar11;
    this->m_lastLogTime = dVar11;
  }
  prog._7_1_ = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::
               has(this->m_programs,(string *)local_60);
  if (!(bool)prog._7_1_) {
    LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::make
              (this->m_programs,(string *)local_60);
  }
  local_200 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::
              get(this->m_programs,(string *)local_60);
  if (((prog._7_1_ & 1) == 0) ||
     (fVar25 = de::Random::getFloat(&this->m_rnd), fVar25 < (this->m_probabilities).rebuildProgram))
  {
    iVar6 = this->m_currentIteration;
    dVar11 = deGetTime();
    dVar7 = deUint64Hash((long)iVar6 ^ dVar11);
    local_222 = (unsigned_short)dVar7;
    de::toString<unsigned_short>(&local_220,&local_222);
    std::__cxx11::string::operator=
              ((string *)(programName.field_2._8_8_ + 0x60),(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    pPVar12 = local_200;
    mangleShaderNames(&local_248,&source->vertexSource,(string *)(programName.field_2._8_8_ + 0x60))
    ;
    mangleShaderNames((string *)&program,&source->fragmentSource,
                      (string *)(programName.field_2._8_8_ + 0x60));
    LongStressCaseInternal::Program::setSources(pPVar12,&local_248,(string *)&program);
    std::__cxx11::string::~string((string *)&program);
    std::__cxx11::string::~string((string *)&local_248);
    LongStressCaseInternal::Program::build(local_200,_renderHeight);
  }
  LongStressCaseInternal::Program::use(local_200);
  pPVar12 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Program>::get
                      (this->m_programs,(string *)local_60);
  for (texName.field_2._12_4_ = 0; uVar3 = texName.field_2._12_4_,
      sVar10 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::size
                         (&source->textureSpecs), (int)uVar3 < (int)sVar10;
      texName.field_2._12_4_ = texName.field_2._12_4_ + 1) {
    de::toString<int>((string *)local_2b8,(int *)(texName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    spec._7_1_ = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>
                 ::has(this->m_textures,(string *)local_298);
    texture = (Texture *)
              std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
              operator[](&source->textureSpecs,(long)(int)texName.field_2._12_4_);
    if ((spec._7_1_ & 1) == 0) {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::make
                (this->m_textures,(string *)local_298,((const_reference)texture)->textureType);
    }
    if (((spec._7_1_ & 1) == 0) ||
       (fVar25 = de::Random::getFloat(&this->m_rnd),
       fVar25 < (this->m_probabilities).reuploadTexture)) {
      local_2d0 = LongStressCaseInternal::
                  GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::get
                            (this->m_textures,(string *)local_298);
      pGVar1 = this->m_textures;
      iVar6 = this->m_maxTexMemoryUsageBytes;
      iVar8 = LongStressCaseInternal::Texture::getApproxMemUsageDiff
                        (local_2d0,texture->m_numMipLevels,texture->m_internalFormat,
                         texture[1].m_textureGL,(bool)((byte)texture[1].m_numMipLevels & 1));
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
      removeGarbageUntilUnder(pGVar1,iVar6 - iVar8,&this->m_rnd);
      if (((spec._7_1_ & 1) == 0) ||
         (fVar25 = de::Random::getFloat(&this->m_rnd), pTVar16 = local_2d0,
         fVar25 < (this->m_probabilities).reuploadWithTexImage)) {
        pTVar16 = local_2d0;
        pvVar13 = std::
                  vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                  ::operator[]((vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                *)(programName.field_2._8_8_ + 0x48),
                               (long)(int)texName.field_2._12_4_);
        pTVar14 = de::SharedPtr<tcu::TextureLevel>::operator->(pvVar13);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_2f8,pTVar14);
        LongStressCaseInternal::Texture::setData
                  (pTVar16,&local_2f8,texture->m_numMipLevels,texture->m_internalFormat,
                   texture[1].m_textureGL,(bool)((byte)texture[1].m_numMipLevels & 1));
      }
      else {
        pvVar13 = std::
                  vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                  ::operator[]((vector<de::SharedPtr<tcu::TextureLevel>,_std::allocator<de::SharedPtr<tcu::TextureLevel>_>_>
                                *)(programName.field_2._8_8_ + 0x48),
                               (long)(int)texName.field_2._12_4_);
        pTVar14 = de::SharedPtr<tcu::TextureLevel>::operator->(pvVar13);
        tcu::TextureLevel::getAccess
                  ((PixelBufferAccess *)
                   &texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pTVar14);
        LongStressCaseInternal::Texture::setSubData
                  (pTVar16,(ConstPixelBufferAccess *)
                           &texSpecIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0,0,texture->m_numMipLevels,
                   texture->m_internalFormat);
      }
      LongStressCaseInternal::Texture::toUnit(local_2d0,0);
      LongStressCaseInternal::Texture::setWrap(local_2d0,texture[2].m_type,texture[2].m_textureGL);
      LongStressCaseInternal::Texture::setFilter
                (local_2d0,texture[1].m_internalFormat,texture[1].m_dataSizeApprox);
    }
    std::__cxx11::string::~string((string *)local_298);
  }
  sVar10 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::size
                     (&source->textureSpecs);
  std::allocator<int>::allocator(&local_339);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,sVar10,&local_339);
  std::allocator<int>::~allocator(&local_339);
  for (local_340 = 0; iVar6 = local_340,
      sVar10 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i)
      , iVar8 = local_340, iVar6 < (int)sVar10; local_340 = local_340 + 1) {
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)local_340);
    *pvVar15 = iVar8;
  }
  local_348._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&i)
  ;
  iStack_350 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&this->m_rnd,local_348,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             iStack_350._M_current);
  for (local_354 = 0; iVar6 = local_354,
      sVar10 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i)
      , iVar6 < (int)sVar10; local_354 = local_354 + 1) {
    pGVar1 = this->m_textures;
    pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)local_354);
    de::toString<int>(&local_398,pvVar15);
    std::operator+(&local_378,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_398);
    pTVar16 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
              get(pGVar1,&local_378);
    pvVar17 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
              operator[](&source->textureSpecs,(long)local_354);
    LongStressCaseInternal::Texture::toUnit(pTVar16,pvVar17->textureUnit);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_398);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  if ((programContext._6_1_ & 1) == 0) {
    local_3a0._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->m_vertexIndices)
    ;
    iStack_3a8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                           (&this->m_vertexIndices);
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              (&this->m_rnd,local_3a0,
               (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                )iStack_3a8._M_current);
    if ((programContext._7_1_ & 1) == 0) {
      indexBuf._7_1_ =
           LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                     (this->m_buffers,(string *)local_170);
      if (!(bool)indexBuf._7_1_) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                  (this->m_buffers,(string *)local_170);
      }
      _attrNdx = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                 ::get(this->m_buffers,(string *)local_170);
      if (((indexBuf._7_1_ & 1) == 0) ||
         (fVar25 = de::Random::getFloat(&this->m_rnd),
         fVar25 < (this->m_probabilities).reuploadBuffer)) {
        pGVar2 = this->m_buffers;
        iVar6 = this->m_maxBufMemoryUsageBytes;
        iVar8 = LongStressCaseInternal::Buffer::getApproxMemUsageDiff<unsigned_short>
                          (_attrNdx,&this->m_vertexIndices);
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
        removeGarbageUntilUnder(pGVar2,iVar6 - iVar8,&this->m_rnd);
        fVar25 = de::Random::getFloat(&this->m_rnd);
        if ((this->m_probabilities).randomBufferUploadTarget <= fVar25) {
          local_145c = 0x8893;
        }
        else {
          local_145c = randomBufferTarget(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
        }
        usedRedundantBufferNdx = local_145c;
        if (((indexBuf._7_1_ & 1) == 0) ||
           (fVar25 = de::Random::getFloat(&this->m_rnd),
           fVar25 < (this->m_probabilities).reuploadWithBufferData)) {
          pBVar18 = _attrNdx;
          iVar6 = usedRedundantBufferNdx;
          fVar25 = de::Random::getFloat(&this->m_rnd);
          if ((this->m_probabilities).randomBufferUsage <= fVar25) {
            local_1480 = this->m_indexBufferUsage;
          }
          else {
            local_1480 = randomBufferUsage(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
          }
          LongStressCaseInternal::Buffer::setData<unsigned_short>
                    (pBVar18,&this->m_vertexIndices,iVar6,local_1480);
        }
        else {
          LongStressCaseInternal::Buffer::setSubData<unsigned_short>
                    (_attrNdx,&this->m_vertexIndices,0,this->m_numVerticesPerDrawCall,
                     usedRedundantBufferNdx);
        }
      }
    }
  }
  generateAttribs((vector<unsigned_char,_std::allocator<unsigned_char>_> *)programName.field_2._8_8_
                  ,(vector<int,_std::allocator<int>_> *)(programName.field_2._8_8_ + 0x18),
                  (vector<int,_std::allocator<int>_> *)(programName.field_2._8_8_ + 0x30),
                  &source->attributes,&source->positionAttrName,this->m_numVerticesPerDrawCall,
                  &this->m_rnd);
  fVar25 = de::Random::getFloat(&this->m_rnd);
  if (fVar25 < (this->m_probabilities).clientMemoryAttributeData) {
    for (i_5 = 0; iVar6 = i_5,
        sVar10 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                           (&source->attributes), uVar4 = programName.field_2._8_8_,
        iVar6 < (int)sVar10; i_5 = i_5 + 1) {
      pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(programName.field_2._8_8_ + 0x18),
                           (long)i_5);
      pvVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)uVar4,
                           (long)*pvVar15);
      pvVar20 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::operator[]
                          (&source->attributes,(long)i_5);
      LongStressCaseInternal::Program::setAttributeClientMem
                (pPVar12,pvVar19,pvVar20,(string *)(programName.field_2._8_8_ + 0x60));
    }
  }
  else if ((programContext._5_1_ & 1) == 0) {
    iVar6 = de::Random::getInt(&this->m_rnd,0,this->m_redundantBufferFactor + -1);
    for (attrBufName.field_2._12_4_ = 0;
        (int)attrBufName.field_2._12_4_ < this->m_redundantBufferFactor;
        attrBufName.field_2._12_4_ = attrBufName.field_2._12_4_ + 1) {
      de::toString<int>((string *)local_4c8,(int *)(attrBufName.field_2._M_local_buf + 0xc));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8)
      ;
      std::__cxx11::string::~string((string *)local_4c8);
      attrBuf._7_1_ =
           LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                     (this->m_buffers,(string *)local_4a8);
      if (!(bool)attrBuf._7_1_) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                  (this->m_buffers,(string *)local_4a8);
      }
      _i_2 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::get
                       (this->m_buffers,(string *)local_4a8);
      if (((attrBuf._7_1_ & 1) == 0) ||
         (fVar25 = de::Random::getFloat(&this->m_rnd),
         fVar25 < (this->m_probabilities).reuploadBuffer)) {
        pGVar2 = this->m_buffers;
        iVar8 = this->m_maxBufMemoryUsageBytes;
        iVar9 = LongStressCaseInternal::Buffer::getApproxMemUsageDiff<unsigned_char>
                          (_i_2,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                programName.field_2._8_8_);
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
        removeGarbageUntilUnder(pGVar2,iVar8 - iVar9,&this->m_rnd);
        fVar25 = de::Random::getFloat(&this->m_rnd);
        if ((this->m_probabilities).randomBufferUploadTarget <= fVar25) {
          local_1554 = 0x8892;
        }
        else {
          local_1554 = randomBufferTarget(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
        }
        i_3 = local_1554;
        if (((attrBuf._7_1_ & 1) == 0) ||
           (fVar25 = de::Random::getFloat(&this->m_rnd), uVar4 = programName.field_2._8_8_,
           pBVar18 = _i_2, fVar25 < (this->m_probabilities).reuploadWithBufferData)) {
          uVar4 = programName.field_2._8_8_;
          pBVar18 = _i_2;
          iVar8 = i_3;
          fVar25 = de::Random::getFloat(&this->m_rnd);
          if ((this->m_probabilities).randomBufferUsage <= fVar25) {
            local_1578 = this->m_attrBufferUsage;
          }
          else {
            local_1578 = randomBufferUsage(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
          }
          LongStressCaseInternal::Buffer::setData<unsigned_char>
                    (pBVar18,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)uVar4,iVar8,
                     local_1578);
        }
        else {
          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              programName.field_2._8_8_);
          LongStressCaseInternal::Buffer::setSubData<unsigned_char>
                    (pBVar18,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)uVar4,0,
                     (int)sVar10,i_3);
        }
      }
      if (attrBufName.field_2._12_4_ == iVar6) {
        for (i_4 = 0; iVar8 = i_4,
            sVar10 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                               (&source->attributes), pBVar18 = _i_2, iVar8 < (int)sVar10;
            i_4 = i_4 + 1) {
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (programName.field_2._8_8_ + 0x18),(long)i_4);
          iVar8 = *pvVar15;
          pvVar20 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::operator[]
                              (&source->attributes,(long)i_4);
          LongStressCaseInternal::Program::setAttribute
                    (pPVar12,pBVar18,iVar8,pvVar20,(string *)(programName.field_2._8_8_ + 0x60));
        }
      }
      std::__cxx11::string::~string((string *)local_4a8);
    }
  }
  else {
    for (redundantBufferNdx = 0; iVar6 = redundantBufferNdx,
        sVar10 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                           (&source->attributes), iVar6 < (int)sVar10;
        redundantBufferNdx = redundantBufferNdx + 1) {
      curAttrBufName.field_2._12_4_ =
           de::Random::getInt(&this->m_rnd,0,this->m_redundantBufferFactor + -1);
      for (curAttrBufName.field_2._8_4_ = 0;
          (int)curAttrBufName.field_2._8_4_ < this->m_redundantBufferFactor;
          curAttrBufName.field_2._8_4_ = curAttrBufName.field_2._8_4_ + 1) {
        de::toString<int>(&local_448,&redundantBufferNdx);
        std::operator+(&local_428,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0,&local_448);
        std::operator+(&local_408,&local_428,"_");
        de::toString<int>((string *)local_468,(int *)(curAttrBufName.field_2._M_local_buf + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e8,&local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_468);
        std::__cxx11::string::~string((string *)local_468);
        std::__cxx11::string::~string((string *)&local_408);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        bVar5 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
                has(this->m_buffers,(string *)local_3e8);
        if (!bVar5) {
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
                    (this->m_buffers,(string *)local_3e8);
        }
        pBVar18 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::get(this->m_buffers,(string *)local_3e8);
        if ((!bVar5) ||
           (fVar25 = de::Random::getFloat(&this->m_rnd),
           fVar25 < (this->m_probabilities).reuploadBuffer)) {
          pGVar2 = this->m_buffers;
          iVar6 = this->m_maxBufMemoryUsageBytes;
          pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               (programName.field_2._8_8_ + 0x30),(long)redundantBufferNdx);
          iVar8 = LongStressCaseInternal::Buffer::getApproxMemUsageDiff(pBVar18,*pvVar15);
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
          removeGarbageUntilUnder(pGVar2,iVar6 - iVar8,&this->m_rnd);
          fVar25 = de::Random::getFloat(&this->m_rnd);
          if ((this->m_probabilities).randomBufferUploadTarget <= fVar25) {
            local_14c4 = 0x8892;
          }
          else {
            local_14c4 = randomBufferTarget(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
          }
          if ((!bVar5) ||
             (fVar25 = de::Random::getFloat(&this->m_rnd), uVar4 = programName.field_2._8_8_,
             fVar25 < (this->m_probabilities).reuploadWithBufferData)) {
            uVar4 = programName.field_2._8_8_;
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (programName.field_2._8_8_ + 0x18),(long)redundantBufferNdx);
            pvVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)uVar4,
                                 (long)*pvVar15);
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (programName.field_2._8_8_ + 0x30),(long)redundantBufferNdx);
            iVar6 = *pvVar15;
            fVar25 = de::Random::getFloat(&this->m_rnd);
            if ((this->m_probabilities).randomBufferUsage <= fVar25) {
              local_14f8 = this->m_attrBufferUsage;
            }
            else {
              local_14f8 = randomBufferUsage(&this->m_rnd,(bool)(this->m_isGLES3 & 1));
            }
            LongStressCaseInternal::Buffer::setData(pBVar18,pvVar19,iVar6,local_14c4,local_14f8);
          }
          else {
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (programName.field_2._8_8_ + 0x18),(long)redundantBufferNdx);
            pvVar19 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)uVar4,
                                 (long)*pvVar15);
            pvVar15 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 (programName.field_2._8_8_ + 0x30),(long)redundantBufferNdx);
            LongStressCaseInternal::Buffer::setSubData(pBVar18,pvVar19,0,*pvVar15,local_14c4);
          }
        }
        if (curAttrBufName.field_2._8_4_ == curAttrBufName.field_2._12_4_) {
          pvVar20 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::operator[]
                              (&source->attributes,(long)redundantBufferNdx);
          LongStressCaseInternal::Program::setAttribute
                    (pPVar12,pBVar18,0,pvVar20,(string *)(programName.field_2._8_8_ + 0x60));
        }
        std::__cxx11::string::~string((string *)local_3e8);
      }
    }
  }
  glwViewport(0,0,iStack_24,progContextNdx);
  glwClearDepthf(1.0);
  glwClear(0x100);
  glwEnable(0xb71);
  for (local_4e8 = 0; local_4e8 < this->m_numDrawCallsPerIteration; local_4e8 = local_4e8 + 1) {
    LongStressCaseInternal::Program::use(pPVar12);
    pRVar24 = &this->m_rnd;
    LongStressCaseInternal::Program::setRandomUniforms
              (pPVar12,&source->uniforms,(string *)(programName.field_2._8_8_ + 0x60),pRVar24);
    __len = (socklen_t)pRVar24;
    if ((programContext._6_1_ & 1) == 0) {
      if ((programContext._7_1_ & 1) == 0) {
        pBVar18 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>
                  ::get(this->m_buffers,(string *)local_170);
        LongStressCaseInternal::Buffer::bind(pBVar18,0x8893,__addr,__len);
        glwDrawElements(5,this->m_numVerticesPerDrawCall,0x1403,(void *)0x0);
      }
      else {
        glwBindBuffer(0x8893,0);
        count = this->m_numVerticesPerDrawCall;
        indices = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            (&this->m_vertexIndices,0);
        glwDrawElements(5,count,0x1403,indices);
      }
    }
    else {
      glwDrawArrays(5,0,this->m_numVerticesPerDrawCall);
    }
  }
  for (loggingIntervalSeconds._4_4_ = 0; iVar6 = loggingIntervalSeconds._4_4_,
      sVar10 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                         (&source->attributes), iVar6 < (int)sVar10;
      loggingIntervalSeconds._4_4_ = loggingIntervalSeconds._4_4_ + 1) {
    pvVar20 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::operator[]
                        (&source->attributes,(long)loggingIntervalSeconds._4_4_);
    LongStressCaseInternal::Program::disableAttributeArray
              (pPVar12,pvVar20,(string *)(programName.field_2._8_8_ + 0x60));
  }
  if ((this->m_showDebugInfo & 1U) != 0) {
    this_00 = this->m_debugInfoRenderer;
    dVar21 = deGetTime();
    dVar11 = this->m_startTimeSeconds;
    iVar8 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
            computeApproxMemUsage(this->m_textures);
    iVar6 = this->m_maxTexMemoryUsageBytes;
    iVar9 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            computeApproxMemUsage(this->m_buffers);
    LongStressCaseInternal::DebugInfoRenderer::drawInfo
              (this_00,dVar21 - dVar11,iVar8,iVar6,iVar9,this->m_maxBufMemoryUsageBytes,
               this->m_currentIteration);
  }
  if (0 < this->m_currentIteration) {
    time = 10;
    timeDiff = deGetTime();
    pTVar22 = _renderHeight;
    uStack_508 = timeDiff - this->m_lastLogTime;
    local_50c = this->m_currentIteration - this->m_lastLogIteration;
    if ((9 < uStack_508) || (this->m_currentIteration == this->m_numIterations + -1)) {
      de::toString<int>(&local_1010,&this->m_currentLogEntryNdx);
      std::operator+(&local_ff0,"LogEntry",&local_1010);
      de::toString<int>(&local_1050,&this->m_currentLogEntryNdx);
      std::operator+(&local_1030,"Log entry ",&local_1050);
      tcu::LogSection::LogSection(&local_fd0,&local_ff0,&local_1030);
      pTVar22 = tcu::TestLog::operator<<(pTVar22,&local_fd0);
      tcu::TestLog::operator<<(&local_f90,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<(&local_f90,(char (*) [15])"Time elapsed: ");
      getTimeStr_abi_cxx11_(&local_1070,(gls *)(timeDiff - this->m_startTimeSeconds),seconds);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_1070);
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_e10,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<(&local_e10,(char (*) [15])"Frame number: ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&this->m_currentIteration);
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_c90,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (&local_c90,(char (*) [28])"Time since last log entry: ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&stack0xfffffffffffffaf8);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [2])0x2bdda5b);
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_b10,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (&local_b10,(char (*) [30])"Frames since last log entry: ");
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_50c);
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_990,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (&local_990,(char (*) [42])"Average frame time since last log entry: ");
      local_1694 = (float)uStack_508;
      de::floatToString_abi_cxx11_
                (&local_1090,(de *)0x2,local_1694 / (float)local_50c,(int)(uStack_508 >> 1));
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_1090);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [2])0x2bdda5b);
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_810,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (&local_810,(char (*) [35])"Approximate texture memory usage: ");
      iVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
              computeApproxMemUsage(this->m_textures);
      de::floatToString_abi_cxx11_(&local_10b0,(de *)0x2,(float)iVar6 * 9.536743e-07,precision);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_10b0);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [8])" MiB / ");
      de::floatToString_abi_cxx11_
                (&local_10d0,(de *)0x2,(float)this->m_maxTexMemoryUsageBytes * 9.536743e-07,
                 precision_00);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_10d0);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [5])" MiB");
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(&local_690,pTVar22,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (&local_690,(char (*) [34])"Approximate buffer memory usage: ");
      iVar6 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              computeApproxMemUsage(this->m_buffers);
      de::floatToString_abi_cxx11_(&local_10f0,(de *)0x2,(float)iVar6 * 9.536743e-07,precision_01);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&local_10f0);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [8])" MiB / ");
      de::floatToString_abi_cxx11_
                ((string *)local_1110,(de *)0x2,(float)this->m_maxBufMemoryUsageBytes * 9.536743e-07
                 ,precision_02);
      pMVar23 = tcu::MessageBuilder::operator<<
                          (pMVar23,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1110);
      pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,(char (*) [5])" MiB");
      pTVar22 = tcu::MessageBuilder::operator<<
                          (pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::TestLog::operator<<(pTVar22,(EndSectionToken *)&tcu::TestLog::EndSection);
      std::__cxx11::string::~string((string *)local_1110);
      std::__cxx11::string::~string((string *)&local_10f0);
      tcu::MessageBuilder::~MessageBuilder(&local_690);
      std::__cxx11::string::~string((string *)&local_10d0);
      std::__cxx11::string::~string((string *)&local_10b0);
      tcu::MessageBuilder::~MessageBuilder(&local_810);
      std::__cxx11::string::~string((string *)&local_1090);
      tcu::MessageBuilder::~MessageBuilder(&local_990);
      tcu::MessageBuilder::~MessageBuilder(&local_b10);
      tcu::MessageBuilder::~MessageBuilder(&local_c90);
      tcu::MessageBuilder::~MessageBuilder(&local_e10);
      std::__cxx11::string::~string((string *)&local_1070);
      tcu::MessageBuilder::~MessageBuilder(&local_f90);
      tcu::LogSection::~LogSection(&local_fd0);
      std::__cxx11::string::~string((string *)&local_1030);
      std::__cxx11::string::~string((string *)&local_1050);
      std::__cxx11::string::~string((string *)&local_ff0);
      std::__cxx11::string::~string((string *)&local_1010);
      this->m_lastLogTime = timeDiff;
      this->m_lastLogIteration = this->m_currentIteration;
      this->m_currentLogEntryNdx = this->m_currentLogEntryNdx + 1;
    }
  }
  for (texName_1.field_2._12_4_ = 0; uVar3 = texName_1.field_2._12_4_,
      sVar10 = std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::size
                         (&source->textureSpecs), (int)uVar3 < (int)sVar10;
      texName_1.field_2._12_4_ = texName_1.field_2._12_4_ + 1) {
    de::toString<int>((string *)local_1158,(int *)(texName_1.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1158);
    std::__cxx11::string::~string((string *)local_1158);
    fVar25 = de::Random::getFloat(&this->m_rnd);
    if ((this->m_probabilities).deleteTexture <= fVar25) {
      fVar25 = de::Random::getFloat(&this->m_rnd);
      if (fVar25 < (this->m_probabilities).wastefulTextureMemoryUsage) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
        markAsGarbage(this->m_textures,(string *)local_1138);
      }
    }
    else {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::remove
                (this->m_textures,local_1138);
    }
    std::__cxx11::string::~string((string *)local_1138);
  }
  bVar5 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                    (this->m_buffers,(string *)local_170);
  if (bVar5) {
    fVar25 = de::Random::getFloat(&this->m_rnd);
    if ((this->m_probabilities).deleteBuffer <= fVar25) {
      fVar25 = de::Random::getFloat(&this->m_rnd);
      if (fVar25 < (this->m_probabilities).wastefulBufferMemoryUsage) {
        LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
        markAsGarbage(this->m_buffers,(string *)local_170);
      }
    }
    else {
      LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::remove
                (this->m_buffers,local_170);
    }
  }
  if ((programContext._5_1_ & 1) == 0) {
    pGVar2 = this->m_buffers;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   "0");
    bVar5 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::has
                      (pGVar2,(string *)local_1290);
    std::__cxx11::string::~string((string *)local_1290);
    if (bVar5) {
      fVar25 = de::Random::getFloat(&this->m_rnd);
      if ((this->m_probabilities).deleteBuffer <= fVar25) {
        fVar25 = de::Random::getFloat(&this->m_rnd);
        if (fVar25 < (this->m_probabilities).wastefulBufferMemoryUsage) {
          for (local_12dc = 0; local_12dc < this->m_redundantBufferFactor;
              local_12dc = local_12dc + 1) {
            pGVar2 = this->m_buffers;
            de::toString<int>(&local_1320,&local_12dc);
            std::operator+(&local_1300,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_110,&local_1320);
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            markAsGarbage(pGVar2,&local_1300);
            std::__cxx11::string::~string((string *)&local_1300);
            std::__cxx11::string::~string((string *)&local_1320);
          }
        }
      }
      else {
        for (local_1294 = 0; local_1294 < this->m_redundantBufferFactor; local_1294 = local_1294 + 1
            ) {
          pGVar2 = this->m_buffers;
          de::toString<int>((string *)local_12d8,&local_1294);
          std::operator+(&local_12b8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_12d8);
          LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::remove
                    (pGVar2,(char *)&local_12b8);
          std::__cxx11::string::~string((string *)&local_12b8);
          std::__cxx11::string::~string((string *)local_12d8);
        }
      }
    }
  }
  else {
    for (curAttrBufNamePrefix.field_2._12_4_ = 0; uVar3 = curAttrBufNamePrefix.field_2._12_4_,
        sVar10 = std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::size
                           (&source->attributes), (int)uVar3 < (int)sVar10;
        curAttrBufNamePrefix.field_2._12_4_ = curAttrBufNamePrefix.field_2._12_4_ + 1) {
      de::toString<int>(&local_11c0,(int *)(curAttrBufNamePrefix.field_2._M_local_buf + 0xc));
      std::operator+(&local_11a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     &local_11c0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1180
                     ,&local_11a0,"_");
      std::__cxx11::string::~string((string *)&local_11a0);
      std::__cxx11::string::~string((string *)&local_11c0);
      pGVar2 = this->m_buffers;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_11e0
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1180,"0");
      bVar5 = LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              has(pGVar2,(string *)local_11e0);
      std::__cxx11::string::~string((string *)local_11e0);
      if (bVar5) {
        fVar25 = de::Random::getFloat(&this->m_rnd);
        if ((this->m_probabilities).deleteBuffer <= fVar25) {
          fVar25 = de::Random::getFloat(&this->m_rnd);
          if (fVar25 < (this->m_probabilities).wastefulBufferMemoryUsage) {
            for (local_122c = 0; local_122c < this->m_redundantBufferFactor;
                local_122c = local_122c + 1) {
              pGVar2 = this->m_buffers;
              de::toString<int>(&local_1270,&local_122c);
              std::operator+(&local_1250,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1180,&local_1270);
              LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
              markAsGarbage(pGVar2,&local_1250);
              std::__cxx11::string::~string((string *)&local_1250);
              std::__cxx11::string::~string((string *)&local_1270);
            }
          }
        }
        else {
          for (local_11e4 = 0; local_11e4 < this->m_redundantBufferFactor;
              local_11e4 = local_11e4 + 1) {
            pGVar2 = this->m_buffers;
            de::toString<int>((string *)local_1228,&local_11e4);
            std::operator+(&local_1208,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1180,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1228);
            LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::
            remove(pGVar2,(char *)&local_1208);
            std::__cxx11::string::~string((string *)&local_1208);
            std::__cxx11::string::~string((string *)local_1228);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_1180);
    }
  }
  err = glwGetError();
  glu::checkError(err,"End of LongStressCase::iterate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLongStressCase.cpp"
                  ,0x625);
  this->m_currentIteration = this->m_currentIteration + 1;
  bVar5 = this->m_currentIteration != this->m_numIterations;
  if (!bVar5) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Passed");
  }
  this_local._4_4_ = (IterateResult)bVar5;
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_60);
  return this_local._4_4_;
}

Assistant:

LongStressCase::IterateResult LongStressCase::iterate (void)
{
	TestLog&					log							= m_testCtx.getLog();
	const int					renderWidth					= m_renderCtx.getRenderTarget().getWidth();
	const int					renderHeight				= m_renderCtx.getRenderTarget().getHeight();
	const bool					useClientMemoryIndexData	= m_rnd.getFloat() < m_probabilities.clientMemoryIndexData;
	const bool					useDrawArrays				= m_rnd.getFloat() < m_probabilities.useDrawArrays;
	const bool					separateAttributeBuffers	= m_rnd.getFloat() < m_probabilities.separateAttributeBuffers;
	const int					progContextNdx				= m_rnd.getInt(0, (int)m_programContexts.size()-1);
	const ProgramContext&		programContext				= m_programContexts[progContextNdx];
	ProgramResources&			programResources			= m_programResources[progContextNdx];
	const string				programName					= "prog" + toString(progContextNdx);
	const string				textureNamePrefix			= "tex" + toString(progContextNdx) + "_";
	const string				unitedAttrBufferNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";
	const string				indexBufferName				= "indexBuf" + toString(progContextNdx);
	const string				separateAttrBufNamePrefix	= "attrBuf" + toString(progContextNdx) + "_";

	if (m_currentIteration == 0)
		m_lastLogTime = m_startTimeSeconds = deGetTime();

	// Make or re-compile programs.
	{
		const bool hadProgram = m_programs->has(programName);

		if (!hadProgram)
			m_programs->make(programName);

		Program& prog = m_programs->get(programName);

		if (!hadProgram || m_rnd.getFloat() < m_probabilities.rebuildProgram)
		{
			programResources.shaderNameManglingSuffix = toString((deUint16)deUint64Hash((deUint64)m_currentIteration ^ deGetTime()));

			prog.setSources(mangleShaderNames(programContext.vertexSource, programResources.shaderNameManglingSuffix),
							mangleShaderNames(programContext.fragmentSource, programResources.shaderNameManglingSuffix));

			prog.build(log);
		}

		prog.use();
	}

	Program& program = m_programs->get(programName);

	// Make or re-upload textures.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string		texName		= textureNamePrefix + toString(texNdx);
		const bool			hadTexture	= m_textures->has(texName);
		const TextureSpec&	spec		= programContext.textureSpecs[texNdx];

		if (!hadTexture)
			m_textures->make(texName, spec.textureType);

		if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadTexture)
		{
			Texture& texture = m_textures->get(texName);

			m_textures->removeGarbageUntilUnder(m_maxTexMemoryUsageBytes - texture.getApproxMemUsageDiff(spec.width, spec.height, spec.internalFormat, spec.useMipmap), m_rnd);

			if (!hadTexture || m_rnd.getFloat() < m_probabilities.reuploadWithTexImage)
				texture.setData(programResources.dummyTextures[texNdx]->getAccess(), spec.width, spec.height, spec.internalFormat, spec.useMipmap);
			else
				texture.setSubData(programResources.dummyTextures[texNdx]->getAccess(), 0, 0, spec.width, spec.height);

			texture.toUnit(0);
			texture.setWrap(spec.sWrap, spec.tWrap);
			texture.setFilter(spec.minFilter, spec.magFilter);
		}
	}

	// Bind textures to units, in random order (because when multiple texture specs have same unit, we want to pick one randomly).

	{
		vector<int> texSpecIndices(programContext.textureSpecs.size());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			texSpecIndices[i] = i;
		m_rnd.shuffle(texSpecIndices.begin(), texSpecIndices.end());
		for (int i = 0; i < (int)texSpecIndices.size(); i++)
			m_textures->get(textureNamePrefix + toString(texSpecIndices[i])).toUnit(programContext.textureSpecs[i].textureUnit);
	}

	// Make or re-upload index buffer.

	if (!useDrawArrays)
	{
		m_rnd.shuffle(m_vertexIndices.begin(), m_vertexIndices.end());

		if (!useClientMemoryIndexData)
		{
			const bool hadIndexBuffer = m_buffers->has(indexBufferName);

			if (!hadIndexBuffer)
				m_buffers->make(indexBufferName);

			Buffer& indexBuf = m_buffers->get(indexBufferName);

			if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
			{
				m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - indexBuf.getApproxMemUsageDiff(m_vertexIndices), m_rnd);
				const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ELEMENT_ARRAY_BUFFER;

				if (!hadIndexBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
					indexBuf.setData(m_vertexIndices, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_indexBufferUsage);
				else
					indexBuf.setSubData(m_vertexIndices, 0, m_numVerticesPerDrawCall, target);
			}
		}
	}

	// Set vertex attributes. If not using client-memory data, make or re-upload attribute buffers.

	generateAttribs(programResources.attrDataBuf, programResources.attrDataOffsets, programResources.attrDataSizes,
					programContext.attributes, programContext.positionAttrName, m_numVerticesPerDrawCall, m_rnd);

	if (!(m_rnd.getFloat() < m_probabilities.clientMemoryAttributeData))
	{
		if (separateAttributeBuffers)
		{
			for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
			{
				const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

				for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
				{
					const string	curAttrBufName		= separateAttrBufNamePrefix + toString(attrNdx) + "_" + toString(redundantBufferNdx);
					const bool		hadCurAttrBuffer	= m_buffers->has(curAttrBufName);

					if (!hadCurAttrBuffer)
						m_buffers->make(curAttrBufName);

					Buffer& curAttrBuf = m_buffers->get(curAttrBufName);

					if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
					{
						m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - curAttrBuf.getApproxMemUsageDiff(programResources.attrDataSizes[attrNdx]), m_rnd);
						const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

						if (!hadCurAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
							curAttrBuf.setData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], programResources.attrDataSizes[attrNdx], target,
											   m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
						else
							curAttrBuf.setSubData(&programResources.attrDataBuf[programResources.attrDataOffsets[attrNdx]], 0, programResources.attrDataSizes[attrNdx], target);
					}

					if (redundantBufferNdx == usedRedundantBufferNdx)
						program.setAttribute(curAttrBuf, 0, programContext.attributes[attrNdx], programResources.shaderNameManglingSuffix);
				}
			}
		}
		else
		{
			const int usedRedundantBufferNdx = m_rnd.getInt(0, m_redundantBufferFactor-1);

			for (int redundantBufferNdx = 0; redundantBufferNdx < m_redundantBufferFactor; redundantBufferNdx++)
			{
				const string	attrBufName		= unitedAttrBufferNamePrefix + toString(redundantBufferNdx);
				const bool		hadAttrBuffer	= m_buffers->has(attrBufName);

				if (!hadAttrBuffer)
					m_buffers->make(attrBufName);

				Buffer& attrBuf = m_buffers->get(attrBufName);

				if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadBuffer)
				{
					m_buffers->removeGarbageUntilUnder(m_maxBufMemoryUsageBytes - attrBuf.getApproxMemUsageDiff(programResources.attrDataBuf), m_rnd);
					const deUint32 target = m_rnd.getFloat() < m_probabilities.randomBufferUploadTarget ? randomBufferTarget(m_rnd, m_isGLES3) : GL_ARRAY_BUFFER;

					if (!hadAttrBuffer || m_rnd.getFloat() < m_probabilities.reuploadWithBufferData)
						attrBuf.setData(programResources.attrDataBuf, target, m_rnd.getFloat() < m_probabilities.randomBufferUsage ? randomBufferUsage(m_rnd, m_isGLES3) : m_attrBufferUsage);
					else
						attrBuf.setSubData(programResources.attrDataBuf, 0, (int)programResources.attrDataBuf.size(), target);
				}

				if (redundantBufferNdx == usedRedundantBufferNdx)
				{
					for (int i = 0; i < (int)programContext.attributes.size(); i++)
						program.setAttribute(attrBuf, programResources.attrDataOffsets[i], programContext.attributes[i], programResources.shaderNameManglingSuffix);
				}
			}
		}
	}
	else
	{
		for (int i = 0; i < (int)programContext.attributes.size(); i++)
			program.setAttributeClientMem(&programResources.attrDataBuf[programResources.attrDataOffsets[i]], programContext.attributes[i], programResources.shaderNameManglingSuffix);
	}

	// Draw.

	glViewport(0, 0, renderWidth, renderHeight);

	glClearDepthf(1.0f);
	glClear(GL_DEPTH_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);

	for (int i = 0; i < m_numDrawCallsPerIteration; i++)
	{
		program.use();
		program.setRandomUniforms(programContext.uniforms, programResources.shaderNameManglingSuffix, m_rnd);

		if (useDrawArrays)
			glDrawArrays(GL_TRIANGLE_STRIP, 0, m_numVerticesPerDrawCall);
		else
		{
			if (useClientMemoryIndexData)
			{
				glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, &m_vertexIndices[0]);
			}
			else
			{
				m_buffers->get(indexBufferName).bind(GL_ELEMENT_ARRAY_BUFFER);
				glDrawElements(GL_TRIANGLE_STRIP, m_numVerticesPerDrawCall, GL_UNSIGNED_SHORT, DE_NULL);
			}
		}
	}

	for(int i = 0; i < (int)programContext.attributes.size(); i++)
		program.disableAttributeArray(programContext.attributes[i], programResources.shaderNameManglingSuffix);

	if (m_showDebugInfo)
		m_debugInfoRenderer->drawInfo(deGetTime()-m_startTimeSeconds, m_textures->computeApproxMemUsage(), m_maxTexMemoryUsageBytes, m_buffers->computeApproxMemUsage(), m_maxBufMemoryUsageBytes, m_currentIteration);

	if (m_currentIteration > 0)
	{
		// Log if a certain amount of time has passed since last log entry (or if this is the last iteration).

		const deUint64	loggingIntervalSeconds	= 10;
		const deUint64	time					= deGetTime();
		const deUint64	timeDiff				= time - m_lastLogTime;
		const int		iterDiff				= m_currentIteration - m_lastLogIteration;

		if (timeDiff >= loggingIntervalSeconds || m_currentIteration == m_numIterations-1)
		{
			log << TestLog::Section("LogEntry" + toString(m_currentLogEntryNdx), "Log entry " + toString(m_currentLogEntryNdx))
				<< TestLog::Message << "Time elapsed: " << getTimeStr(time - m_startTimeSeconds) << TestLog::EndMessage
				<< TestLog::Message << "Frame number: " << m_currentIteration << TestLog::EndMessage
				<< TestLog::Message << "Time since last log entry: " << timeDiff << "s" << TestLog::EndMessage
				<< TestLog::Message << "Frames since last log entry: " << iterDiff << TestLog::EndMessage
				<< TestLog::Message << "Average frame time since last log entry: " << de::floatToString((float)timeDiff / (float)iterDiff, 2) << "s" << TestLog::EndMessage
				<< TestLog::Message << "Approximate texture memory usage: "
									<< de::floatToString((float)m_textures->computeApproxMemUsage() / Mi, 2) << " MiB / "
									<< de::floatToString((float)m_maxTexMemoryUsageBytes / Mi, 2) << " MiB"
									<< TestLog::EndMessage
				<< TestLog::Message << "Approximate buffer memory usage: "
										<< de::floatToString((float)m_buffers->computeApproxMemUsage() / Mi, 2) << " MiB / "
										<< de::floatToString((float)m_maxBufMemoryUsageBytes / Mi, 2) << " MiB"
										<< TestLog::EndMessage
				<< TestLog::EndSection;

			m_lastLogTime		= time;
			m_lastLogIteration	= m_currentIteration;
			m_currentLogEntryNdx++;
		}
	}

	// Possibly remove or set-as-garbage some objects, depending on given probabilities.

	for (int texNdx = 0; texNdx < (int)programContext.textureSpecs.size(); texNdx++)
	{
		const string texName = textureNamePrefix + toString(texNdx);
		if (m_rnd.getFloat() < m_probabilities.deleteTexture)
			m_textures->remove(texName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulTextureMemoryUsage)
			m_textures->markAsGarbage(texName);

	}

	if (m_buffers->has(indexBufferName))
	{
		if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			m_buffers->remove(indexBufferName);
		else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			m_buffers->markAsGarbage(indexBufferName);

	}

	if (separateAttributeBuffers)
	{
		for (int attrNdx = 0; attrNdx < (int)programContext.attributes.size(); attrNdx++)
		{
			const string curAttrBufNamePrefix = separateAttrBufNamePrefix + toString(attrNdx) + "_";

			if (m_buffers->has(curAttrBufNamePrefix + "0"))
			{
				if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->remove(curAttrBufNamePrefix + toString(i));
				}
				else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
				{
					for (int i = 0; i < m_redundantBufferFactor; i++)
						m_buffers->markAsGarbage(curAttrBufNamePrefix + toString(i));
				}
			}
		}
	}
	else
	{
		if (m_buffers->has(unitedAttrBufferNamePrefix + "0"))
		{
			if (m_rnd.getFloat() < m_probabilities.deleteBuffer)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->remove(unitedAttrBufferNamePrefix + toString(i));
			}
			else if (m_rnd.getFloat() < m_probabilities.wastefulBufferMemoryUsage)
			{
				for (int i = 0; i < m_redundantBufferFactor; i++)
					m_buffers->markAsGarbage(unitedAttrBufferNamePrefix + toString(i));
			}
		}
	}

	GLU_CHECK_MSG("End of LongStressCase::iterate()");

	m_currentIteration++;
	if (m_currentIteration == m_numIterations)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
	else
		return CONTINUE;
}